

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestEagerMaybeLazy::_InternalSerialize
          (TestEagerMaybeLazy *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestAllTypes *pTVar1;
  TestEagerMaybeLazy_NestedMessage *value;
  ulong uVar2;
  anon_union_32_1_493b367e_for_TestEagerMaybeLazy_3 aVar3;
  uint8_t *puVar4;
  
  aVar3 = this->field_0;
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    pTVar1 = (this->field_0)._impl_.message_foo_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)pTVar1,(pTVar1->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
    pTVar1 = (this->field_0)._impl_.message_bar_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)pTVar1,(pTVar1->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
    value = (this->field_0)._impl_.message_baz_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (3,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestEagerMaybeLazy::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestEagerMaybeLazy& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestEagerMaybeLazy)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestAllTypes message_foo = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.message_foo_, this_._impl_.message_foo_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestAllTypes message_bar = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.message_bar_, this_._impl_.message_bar_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestEagerMaybeLazy.NestedMessage message_baz = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.message_baz_, this_._impl_.message_baz_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestEagerMaybeLazy)
  return target;
}